

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O0

Book * __thiscall
Library::checkout_book(Book *__return_storage_ptr__,Library *this,Patron *patron,string *isbn)

{
  code *pcVar1;
  bool bVar2;
  __type_conflict _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  reference local_48;
  Book *book;
  iterator __end1;
  iterator __begin1;
  vector<Book,_std::allocator<Book>_> *__range1;
  string *isbn_local;
  Patron *patron_local;
  Library *this_local;
  
  __end1 = std::vector<Book,_std::allocator<Book>_>::begin(&this->books);
  book = (Book *)std::vector<Book,_std::allocator<Book>_>::end(&this->books);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_>
                                *)&book);
    if (!bVar2) {
      std::operator+(&local_a8,"Error in Library::checkout_book() - Book with ISBN=",isbn);
      std::operator+(&local_88,&local_a8," not found.");
      error(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_48 = __gnu_cxx::__normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_>::
               operator*(&__end1);
    Book::get_isbn_abi_cxx11_(&local_68,local_48);
    _Var3 = std::operator==(&local_68,isbn);
    std::__cxx11::string::~string((string *)&local_68);
    if (_Var3) break;
    __gnu_cxx::__normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_>::operator++
              (&__end1);
  }
  checkout_book(__return_storage_ptr__,this,patron,local_48);
  return __return_storage_ptr__;
}

Assistant:

Book Library::checkout_book(const Patron& patron, const std::string& isbn)
{
	for (const auto& book : books)
		if (book.get_isbn() == isbn)
			return checkout_book(patron, book);
	error("Error in Library::checkout_book() - Book with ISBN="
		+ isbn + " not found.");
}